

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeSolutionHDivT<std::complex<double>>
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  int iVar1;
  long *plVar2;
  TPZCompMesh *pTVar3;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar5;
  int64_t iVar6;
  int64_t iVar7;
  long lVar8;
  int64_t iVar9;
  TPZFNMatrix<9,_double> *pTVar10;
  Fad<double> *pFVar11;
  double *pdVar12;
  complex<double> *pcVar13;
  long in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  TPZFMatrix<Fad<double>_> *this_00;
  int kdim;
  int ilinha;
  int i_2;
  TPZManVector<double,_3> normal;
  REAL phival;
  complex<double> meshsol;
  int idf;
  int64_t is_1;
  int ish;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  int in;
  int nshapeV;
  int counter;
  int ivec;
  int ishape;
  TPZBlock *block;
  int j;
  int i_1;
  int s_1;
  int gel_dim;
  TPZGeoEl *ref;
  TPZFNMatrix<4,_double> Grad0;
  int s;
  int e;
  int i;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  TPZFNMatrix<3,_double> Normalvec;
  int normvecCols;
  int normvecRows;
  TPZFMatrix<std::complex<double>_> GradOfPhiHdiv;
  int64_t is;
  int64_t numbersol;
  TPZFMatrix<std::complex<double>_> *MeshSol;
  int ncon;
  int nstate;
  int dim;
  TPZFMatrix<double> *in_stack_ffffffffffffeae8;
  TPZFNMatrix<30,_std::complex<double>_> *in_stack_ffffffffffffeaf0;
  TPZCompEl *in_stack_ffffffffffffeaf8;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *in_stack_ffffffffffffeb00;
  double *in_stack_ffffffffffffeb08;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffeb10;
  double *in_stack_ffffffffffffeb18;
  int64_t in_stack_ffffffffffffeb20;
  int64_t in_stack_ffffffffffffeb28;
  TPZFNMatrix<4,_double> *in_stack_ffffffffffffeb30;
  complex<double> *in_stack_ffffffffffffeb38;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffeb40;
  int64_t in_stack_ffffffffffffeb50;
  int64_t in_stack_ffffffffffffeb58;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffeb60;
  int64_t in_stack_ffffffffffffeb88;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *in_stack_ffffffffffffeb90;
  int64_t in_stack_ffffffffffffebb8;
  double dVar14;
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20> *in_stack_ffffffffffffebc0;
  int local_1364;
  int local_1344;
  undefined4 in_stack_ffffffffffffecd0;
  undefined4 in_stack_ffffffffffffecd4;
  TPZVec<double> local_1328;
  double local_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  int local_12d4;
  long local_12d0;
  int local_12c4;
  long local_12c0;
  int local_12b4;
  int64_t local_12b0;
  TPZConnect *local_12a8;
  int local_129c;
  undefined4 local_1298;
  int local_1294;
  int local_1290;
  int local_128c;
  TPZBlock *local_1288;
  int local_1280;
  int local_127c;
  int local_1278;
  int local_1274;
  TPZGeoEl *local_1270;
  undefined8 local_1268;
  int local_11a4;
  int local_11a0;
  int local_119c;
  TPZVec<TPZFNMatrix<9,_double>_> local_1198 [5];
  size_t in_stack_ffffffffffffef08;
  char *in_stack_ffffffffffffef10;
  complex<double> local_58;
  complex<double> local_48;
  int64_t local_38;
  int64_t local_30;
  TPZFMatrix<std::complex<double>_> *local_28;
  int local_1c;
  int local_18;
  undefined4 local_14;
  long local_10;
  
  local_14 = 3;
  local_10 = in_RSI;
  plVar2 = (long *)(**(code **)(*in_RDI + 0xb8))();
  local_18 = (**(code **)(*plVar2 + 0x78))();
  local_1c = (**(code **)(*in_RDI + 0x90))();
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)
                           CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0));
  TPZCompMesh::Solution(pTVar3);
  local_28 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                       ((TPZSolutionMatrix *)in_stack_ffffffffffffeaf0);
  local_30 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_28);
  if (local_30 != 1) {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
  }
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)in_stack_ffffffffffffebc0,
             in_stack_ffffffffffffebb8);
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize
            (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)in_stack_ffffffffffffebc0,
             in_stack_ffffffffffffebb8);
  for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x48d0),
                        local_38);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)(local_18 * 3));
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x48d0),local_38);
    std::complex<double>::complex(&local_48,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38,
               (int64_t)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
    pTVar5 = TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                       ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(local_10 + 0x57f0),
                        local_38);
    (*(pTVar5->super_TPZFMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(pTVar5,(long)(local_18 * 3),3);
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10),
                        local_38);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)local_18);
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10),local_38);
    std::complex<double>::complex(&local_58,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38,
               (int64_t)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50);
  TPZFMatrix<std::complex<double>_>::Zero
            (&in_stack_ffffffffffffeaf0->super_TPZFMatrix<std::complex<double>_>);
  iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x4420));
  iVar7 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(local_10 + 0x4420));
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
             in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector
            (in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88);
  local_119c = 0;
  while( true ) {
    lVar8 = (long)local_119c;
    iVar9 = TPZVec<TPZFNMatrix<9,_double>_>::size(local_1198);
    if (iVar9 <= lVar8) break;
    pTVar10 = TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_119c);
    (*(pTVar10->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar10,3);
    local_119c = local_119c + 1;
  }
  if ((*(byte *)(local_10 + 0x38fc) & 1) == 0) {
    TPZFNMatrix<3,_double>::operator=
              ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    for (local_11a0 = 0; local_11a0 < (int)iVar6; local_11a0 = local_11a0 + 1) {
      for (local_11a4 = 0; local_11a4 < (int)iVar7; local_11a4 = local_11a4 + 1) {
        pFVar11 = TPZFMatrix<Fad<double>_>::operator()
                            (in_stack_ffffffffffffeb10,(int64_t)in_stack_ffffffffffffeb08,
                             (int64_t)in_stack_ffffffffffffeb00);
        pdVar12 = Fad<double>::val(pFVar11);
        dVar14 = *pdVar12;
        pdVar12 = TPZFMatrix<double>::operator()
                            ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                             (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00);
        *pdVar12 = dVar14;
      }
    }
    local_1268 = 0;
    TPZFNMatrix<4,_double>::TPZFNMatrix
              (in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb20,
               in_stack_ffffffffffffeb18);
    local_1270 = TPZCompEl::Reference(in_stack_ffffffffffffeaf8);
    local_1274 = (**(code **)(*(long *)local_1270 + 0x210))();
    for (local_1278 = 0; local_1278 < (int)iVar7; local_1278 = local_1278 + 1) {
      for (local_127c = 0; local_127c < local_1274; local_127c = local_127c + 1) {
        for (local_1280 = 0; local_1280 < local_1274; local_1280 = local_1280 + 1) {
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_ffffffffffffeb10,(int64_t)in_stack_ffffffffffffeb08,
                     (int64_t)in_stack_ffffffffffffeb00);
          pdVar12 = Fad<double>::fastAccessDx
                              ((Fad<double> *)in_stack_ffffffffffffeaf0,
                               (int)((ulong)in_stack_ffffffffffffeae8 >> 0x20));
          dVar14 = *pdVar12;
          pdVar12 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                               (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00
                              );
          *pdVar12 = dVar14;
        }
      }
      TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_1278);
      TPZFNMatrix<9,_double>::operator=
                ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8);
    }
    TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x19fb48a);
  }
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)
                           CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0));
  local_1288 = TPZCompMesh::Block(pTVar3);
  local_128c = 0;
  local_1290 = 0;
  local_1294 = 0;
  iVar6 = TPZVec<std::pair<int,_long>_>::NElements
                    ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0));
  local_1298 = (undefined4)iVar6;
  for (local_129c = 0; local_129c < local_1c; local_129c = local_129c + 1) {
    local_12a8 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_129c);
    local_12b0 = TPZConnect::SequenceNumber(local_12a8);
    local_12b4 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffeaf0,
                                (int)((ulong)in_stack_ffffffffffffeae8 >> 0x20));
    iVar1 = TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffeaf0,
                               (int)((ulong)in_stack_ffffffffffffeae8 >> 0x20));
    local_12c0 = (long)iVar1;
    local_12c4 = 0;
    while( true ) {
      if (local_12b4 / local_18 <= local_12c4) break;
      for (local_12d0 = 0; local_12d0 < local_30; local_12d0 = local_12d0 + 1) {
        for (local_12d4 = 0; local_12d4 < local_18; local_12d4 = local_12d4 + 1) {
          pcVar13 = TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb10,
                               (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00
                              );
          local_12e8 = *(undefined8 *)pcVar13->_M_value;
          uStack_12e0 = *(undefined8 *)(pcVar13->_M_value + 8);
          pdVar12 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                               (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00
                              );
          local_12f0 = *pdVar12;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeb10,
                     (int64_t)in_stack_ffffffffffffeb08);
          for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
            if ((*(byte *)(local_10 + 0x38fc) & 1) == 0) {
              pdVar12 = TPZFMatrix<double>::operator()
                                  ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                                   (int64_t)in_stack_ffffffffffffeb08,
                                   (int64_t)in_stack_ffffffffffffeb00);
              dVar14 = *pdVar12;
              pdVar12 = TPZVec<double>::operator[](&local_1328,(long)iVar1);
              *pdVar12 = dVar14;
            }
            else {
              pFVar11 = TPZFMatrix<Fad<double>_>::operator()
                                  (in_stack_ffffffffffffeb10,(int64_t)in_stack_ffffffffffffeb08,
                                   (int64_t)in_stack_ffffffffffffeb00);
              pdVar12 = Fad<double>::val(pFVar11);
              dVar14 = *pdVar12;
              pdVar12 = TPZVec<double>::operator[](&local_1328,(long)iVar1);
              *pdVar12 = dVar14;
            }
          }
          TPZFMatrix<double>::operator()
                    ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                     (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00);
          std::operator*((double *)in_stack_ffffffffffffeae8,(complex<double> *)0x19fb894);
          pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                             ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(local_10 + 0x8a10)
                              ,local_12d0);
          TPZVec<std::complex<double>_>::operator[]
                    (&pTVar4->super_TPZVec<std::complex<double>_>,(long)local_12d4);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_ffffffffffffeaf0,
                     (complex<double> *)in_stack_ffffffffffffeae8);
          for (local_1344 = 0; local_1344 < 3; local_1344 = local_1344 + 1) {
            TPZVec<double>::operator[](&local_1328,(long)local_1344);
            std::operator*((double *)in_stack_ffffffffffffeae8,(complex<double> *)0x19fb997);
            pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                               ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)
                                (local_10 + 0x48d0),local_12d0);
            TPZVec<std::complex<double>_>::operator[]
                      (&pTVar4->super_TPZVec<std::complex<double>_>,
                       (long)(local_1344 + local_12d4 * 3));
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffeaf0,
                       (complex<double> *)in_stack_ffffffffffffeae8);
            for (local_1364 = 0; local_1364 < 3; local_1364 = local_1364 + 1) {
              TPZFMatrix<std::complex<double>_>::operator()
                        ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb10,
                         (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00);
              std::operator*((complex<double> *)in_stack_ffffffffffffeae8,
                             (complex<double> *)0x19fba78);
              this_00 = (TPZFMatrix<Fad<double>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                        ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(local_10 + 0x57f0),
                         local_12d0);
              TPZFMatrix<std::complex<double>_>::operator()
                        ((TPZFMatrix<std::complex<double>_> *)in_stack_ffffffffffffeb10,
                         (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00);
              std::complex<double>::operator+=
                        ((complex<double> *)in_stack_ffffffffffffeaf0,
                         (complex<double> *)in_stack_ffffffffffffeae8);
              if ((*(byte *)(local_10 + 0x38fc) & 1) != 0) {
                TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1198,(long)local_1290);
                TPZFMatrix<double>::operator()
                          ((TPZFMatrix<double> *)in_stack_ffffffffffffeb10,
                           (int64_t)in_stack_ffffffffffffeb08,(int64_t)in_stack_ffffffffffffeb00);
                std::operator*((complex<double> *)in_stack_ffffffffffffeae8,(double *)0x19fbb67);
                in_stack_ffffffffffffeb08 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)this_00,(int64_t)in_stack_ffffffffffffeb08,
                                (int64_t)in_stack_ffffffffffffeb00);
                std::operator*((complex<double> *)in_stack_ffffffffffffeae8,(double *)0x19fbbcc);
                in_stack_ffffffffffffeb00 =
                     (TPZManVector<TPZFNMatrix<9,_double>,_18> *)
                     CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
                in_stack_ffffffffffffeaf0 =
                     TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                               ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)
                                (local_10 + 0x57f0),local_12d0);
                in_stack_ffffffffffffeae8 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<std::complex<double>_>::operator()
                               ((TPZFMatrix<std::complex<double>_> *)this_00,
                                (int64_t)in_stack_ffffffffffffeb08,
                                (int64_t)in_stack_ffffffffffffeb00);
                std::complex<double>::operator+=
                          ((complex<double> *)in_stack_ffffffffffffeaf0,
                           (complex<double> *)in_stack_ffffffffffffeae8);
                in_stack_ffffffffffffeb10 = this_00;
              }
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeaf0);
        }
      }
      local_1294 = local_1294 + 1;
      local_1290 = local_1290 + 1;
      local_128c = local_128c + 1;
      local_12c4 = local_12c4 + 1;
    }
  }
  TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(in_stack_ffffffffffffeb00);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x19fbd49);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x19fbd56);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}